

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<RegisterExceptionTypeParamTest,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>,_iutest::detail::VariadicTypeList<exception_value>_>
::
EachTest<exception_value,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>_>
::EachTest(EachTest<exception_value,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *this_00;
  string *name_local;
  TestSuite *testsuite_local;
  EachTest<exception_value,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop>_>
  *this_local;
  
  iuIObject::iuIObject(&this->super_iuIObject);
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_00169aa8;
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,testsuite);
  iuFactory<iutest_typed_test_suite_p_name_RegisterExceptionTypeParamTest_::Noop<exception_value>_>
  ::iuFactory(&this->m_factory);
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }